

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object * __thiscall Am_Object::operator=(Am_Object *this,Am_Value *in_value)

{
  Am_ID_Tag AVar1;
  Am_Object_Data *this_00;
  Am_ID_Tag AVar2;
  ostream *poVar3;
  Am_Object_Data *old_data;
  Am_Value *in_value_local;
  Am_Object *this_local;
  
  if ((in_value->value).wrapper_value != (Am_Wrapper *)0x0) {
    AVar1 = in_value->type;
    AVar2 = Am_Object_Data::Am_Object_Data_ID();
    if ((AVar1 != AVar2) && (in_value->type != 1)) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar3 = std::operator<<(poVar3,"** Tried to assign Am_Object ");
      poVar3 = ::operator<<(poVar3,this);
      poVar3 = std::operator<<(poVar3," with a non Am_Object value ");
      poVar3 = ::operator<<(poVar3,in_value);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
  }
  this_00 = this->data;
  this->data = (Am_Object_Data *)in_value->value;
  if (this->data != (Am_Object_Data *)0x0) {
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  if (this_00 != (Am_Object_Data *)0x0) {
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  return this;
}

Assistant:

Am_Object &
Am_Object::operator=(const Am_Value &in_value)
{
  if (in_value.value.wrapper_value &&
      (in_value.type != Am_Object_Data::Am_Object_Data_ID() &&
       in_value.type != Am_ZERO))
    Am_ERRORO("** Tried to assign Am_Object "
                  << *this << " with a non Am_Object value " << in_value,
              *this, Am_NO_SLOT);
  Am_Object_Data *old_data = data;
  data = (Am_Object_Data *)in_value.value.wrapper_value;
  if (data) {
    data->Note_Reference();
  }
  if (old_data)
    old_data->Release();
  return *this;
}